

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O2

int32_t uprv_getMaxValues_63(int32_t column)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar2 = 0x2a75a31;
  if (column != 2) {
    iVar2 = 0;
  }
  iVar1 = 0xb23b8;
  if (column != 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

U_CFUNC int32_t
uprv_getMaxValues(int32_t column) {
    switch(column) {
    case 0:
        return indexes[UPROPS_MAX_VALUES_INDEX];
    case 2:
        return indexes[UPROPS_MAX_VALUES_2_INDEX];
    default:
        return 0;
    }
}